

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

void __thiscall FScanner::PrepareScript(FScanner *this)

{
  size_t sVar1;
  char *pcVar2;
  FScanner *this_local;
  
  sVar1 = FString::Len(&this->ScriptBuffer);
  if (sVar1 != 0) {
    sVar1 = FString::Len(&this->ScriptBuffer);
    pcVar2 = FString::operator[](&this->ScriptBuffer,sVar1 - 1);
    if (*pcVar2 == '\n') goto LAB_0064c25a;
  }
  sVar1 = FString::Len(&this->ScriptBuffer);
  if (sVar1 != 0) {
    sVar1 = FString::Len(&this->ScriptBuffer);
    pcVar2 = FString::operator[](&this->ScriptBuffer,sVar1 - 1);
    if (*pcVar2 == '\0') {
      pcVar2 = FString::LockBuffer(&this->ScriptBuffer);
      sVar1 = FString::Len(&this->ScriptBuffer);
      pcVar2[sVar1 - 1] = '\n';
      FString::UnlockBuffer(&this->ScriptBuffer);
      goto LAB_0064c25a;
    }
  }
  FString::operator+=(&this->ScriptBuffer,'\n');
LAB_0064c25a:
  pcVar2 = FString::operator[](&this->ScriptBuffer,0);
  this->ScriptPtr = pcVar2;
  sVar1 = FString::Len(&this->ScriptBuffer);
  pcVar2 = FString::operator[](&this->ScriptBuffer,sVar1);
  this->ScriptEndPtr = pcVar2;
  this->Line = 1;
  this->End = false;
  this->ScriptOpen = true;
  this->String = this->StringBuffer;
  this->AlreadyGot = false;
  this->LastGotToken = false;
  this->LastGotPtr = (char *)0x0;
  this->LastGotLine = 1;
  this->CMode = false;
  this->Escape = true;
  this->StateMode = '\0';
  this->StateOptions = false;
  this->StringBuffer[0] = '\0';
  FString::operator=(&this->BigStringBuffer,"");
  return;
}

Assistant:

void FScanner::PrepareScript ()
{
	// The scanner requires the file to end with a '\n', so add one if
	// it doesn't already.
	if (ScriptBuffer.Len() == 0 || ScriptBuffer[ScriptBuffer.Len() - 1] != '\n')
	{
		// If the last character in the buffer is a null character, change
		// it to a newline. Otherwise, append a newline to the end.
		if (ScriptBuffer.Len() > 0 && ScriptBuffer[ScriptBuffer.Len() - 1] == '\0')
		{
			ScriptBuffer.LockBuffer()[ScriptBuffer.Len() - 1] = '\n';
			ScriptBuffer.UnlockBuffer();
		}
		else
		{
			ScriptBuffer += '\n';
		}
	}

	ScriptPtr = &ScriptBuffer[0];
	ScriptEndPtr = &ScriptBuffer[ScriptBuffer.Len()];
	Line = 1;
	End = false;
	ScriptOpen = true;
	String = StringBuffer;
	AlreadyGot = false;
	LastGotToken = false;
	LastGotPtr = NULL;
	LastGotLine = 1;
	CMode = false;
	Escape = true;
	StateMode = 0;
	StateOptions = false;
	StringBuffer[0] = '\0';
	BigStringBuffer = "";
}